

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

loader_handle ext_loader_impl_load_from_file(loader_impl impl,loader_path *paths,size_t size)

{
  int iVar1;
  long lVar2;
  ulong in_RDX;
  undefined8 in_RDI;
  size_t iterator;
  loader_impl_ext_handle ext_handle;
  loader_impl_ext ext_impl;
  char *in_stack_00000168;
  loader_impl_ext_handle in_stack_00000170;
  loader_impl_ext in_stack_00000178;
  ulong local_38;
  void *local_8;
  
  lVar2 = loader_impl_get(in_RDI);
  if (lVar2 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = operator_new(0x18);
    memset(local_8,0,0x18);
    loader_impl_ext_handle_type::loader_impl_ext_handle_type
              ((loader_impl_ext_handle_type *)0x1091c0);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
        iVar1 = ext_loader_impl_load_from_file_handle
                          (in_stack_00000178,in_stack_00000170,in_stack_00000168);
        if (iVar1 != 0) {
          return (loader_handle)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

loader_handle ext_loader_impl_load_from_file(loader_impl impl, const loader_path paths[], size_t size)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl == NULL)
	{
		return NULL;
	}

	loader_impl_ext_handle ext_handle = new loader_impl_ext_handle_type();

	if (ext_handle == nullptr)
	{
		return NULL;
	}

	for (size_t iterator = 0; iterator < size; ++iterator)
	{
		if (ext_loader_impl_load_from_file_handle(ext_impl, ext_handle, paths[iterator]) != 0)
		{
			return NULL;
		}
	}

	return ext_handle;
}